

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  pointer pPVar2;
  ArrayIndex AVar3;
  PathArgument *arg;
  pointer key;
  Value *pVVar4;
  
  pPVar2 = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (key = (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_start; pVVar4 = root, key != pPVar2; key = key + 1) {
    pVVar4 = defaultValue;
    if (key->kind_ == kindKey) {
      if (*(char *)&root->bits_ != '\a') break;
      root = Value::operator[](root,&key->key_);
      Value::nullSingleton();
      if (root == &Value::nullSingleton::nullStatic) break;
    }
    else if (key->kind_ == kindIndex) {
      if ((*(char *)&root->bits_ != '\x06') ||
         (uVar1 = key->index_, AVar3 = Value::size(root), AVar3 <= uVar1)) break;
      root = Value::operator[](root,key->index_);
    }
  }
  Value::Value(__return_storage_ptr__,pVVar4);
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}